

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O2

string * __thiscall
flow::ConstantValue<bool,(flow::LiteralType)1>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string_view format_str;
  bool *in_stack_ffffffffffffffe8;
  undefined4 local_c;
  
  local_c = *(undefined4 *)((long)this + 8);
  format_str.size_ = (long)this + 0x10;
  format_str.data_ = (char *)0x16;
  fmt::v5::format<std::__cxx11::string,flow::LiteralType,bool>
            (__return_storage_ptr__,(v5 *)"Constant \'{}\': {} = {}",format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(LiteralType *)((long)this + 0x48),in_stack_ffffffffffffffe8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override {
    return fmt::format("Constant '{}': {} = {}", name(), type(), value_);
  }